

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void Js::VariableWalkerBase::GetReturnedValueResolvedObject
               (ReturnedValue *returnValue,DiagStackFrame *frame,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  char16_t *string;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  charcount_t displayNameBufferLength;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  Var pvVar6;
  LocalObjectAddressForRegSlot *this;
  JavascriptFunction *pJVar7;
  FunctionBody *pFVar8;
  undefined4 extraout_var;
  char16 *pcVar9;
  void **ppvVar10;
  undefined4 *puVar11;
  IDiagObjectModelDisplay *pIVar12;
  char16 *builtInName;
  JavascriptString *displayName;
  undefined8 local_98;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  char16_t *local_30;
  WCHAR *finalName;
  ResolvedObject *pRStack_20;
  DBGPROP_ATTRIB_FLAGS defaultAttributes;
  ResolvedObject *pResolvedObject_local;
  DiagStackFrame *frame_local;
  ReturnedValue *returnValue_local;
  
  finalName._4_4_ = 0x8000020;
  pRStack_20 = pResolvedObject;
  pResolvedObject_local = (ResolvedObject *)frame;
  frame_local = (DiagStackFrame *)returnValue;
  pAVar5 = &GetArenaFromContext(pResolvedObject->scriptContext)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&char16_t::typeinfo,0,0xff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0xd7);
  pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar5,&local_58);
  local_68 = Memory::ArenaAllocator::Alloc;
  local_60 = 0;
  local_30 = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                       ((Memory *)pAVar5,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,0xff);
  if (((ulong)frame_local[1]._vptr_DiagStackFrame & 1) == 0) {
    pJVar7 = Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator->
                       ((WriteBarrierPtr<Js::JavascriptFunction> *)&frame_local->isTopFrame);
    BVar3 = JavascriptFunction::IsScriptFunction(pJVar7);
    string = local_30;
    if (BVar3 == 0) {
      EnterPinnedScope(&builtInName);
      pJVar7 = Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator->
                         ((WriteBarrierPtr<Js::JavascriptFunction> *)&frame_local->isTopFrame);
      builtInName = (char16 *)JavascriptFunction::GetDisplayName(pJVar7);
      pcVar9 = JavascriptString::GetString((JavascriptString *)builtInName);
      displayNameBufferLength = JavascriptString::GetLength((JavascriptString *)builtInName);
      pcVar9 = ParseFunctionName(pcVar9,displayNameBufferLength,pRStack_20->scriptContext);
      swprintf_s((char16_t_conflict *)local_30,0xff,(char16_t_conflict *)L"[%s returned]",pcVar9);
      LeavePinnedScope();
    }
    else {
      pJVar7 = Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator->
                         ((WriteBarrierPtr<Js::JavascriptFunction> *)&frame_local->isTopFrame);
      pFVar8 = JavascriptFunction::GetFunctionBody(pJVar7);
      iVar4 = (*(pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      swprintf_s((char16_t_conflict *)string,0xff,(char16_t_conflict *)L"[%s returned]",
                 CONCAT44(extraout_var,iVar4));
    }
    ppvVar10 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)frame_local);
    pRStack_20->obj = *ppvVar10;
    finalName._4_4_ = finalName._4_4_ | 0x800;
    pRStack_20->address = (IDiagObjectAddress *)0x0;
  }
  else {
    swprintf_s((char16_t_conflict *)local_30,0xff,(char16_t_conflict *)L"[Return value]");
    pvVar6 = (Var)(**(code **)(*(long *)pResolvedObject_local + 0x28))(pResolvedObject_local,0);
    pRStack_20->obj = pvVar6;
    pAVar5 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
             (**(code **)(*(long *)pResolvedObject_local + 0x70))();
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_90,(type_info *)&LocalObjectAddressForRegSlot::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xdc);
    pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar5,&local_90);
    displayName = (JavascriptString *)Memory::ArenaAllocator::Alloc;
    local_98 = 0;
    this = (LocalObjectAddressForRegSlot *)
           new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar5,0x3f67b0);
    LocalObjectAddressForRegSlot::LocalObjectAddressForRegSlot
              (this,(DiagStackFrame *)pResolvedObject_local,0,pRStack_20->obj);
    pRStack_20->address = (IDiagObjectAddress *)this;
  }
  if (pRStack_20->obj == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf2,"(pResolvedObject->obj != nullptr)",
                                "pResolvedObject->obj != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pRStack_20->name = local_30;
  pRStack_20->typeId = TypeIds_Object;
  pIVar12 = ResolvedObject::CreateDisplay(pRStack_20);
  pRStack_20->objectDisplay = pIVar12;
  (*pRStack_20->objectDisplay->_vptr_IDiagObjectModelDisplay[6])
            (pRStack_20->objectDisplay,(ulong)finalName._4_4_);
  return;
}

Assistant:

void VariableWalkerBase::GetReturnedValueResolvedObject(ReturnedValue * returnValue, DiagStackFrame* frame, ResolvedObject* pResolvedObject)
    {
        DBGPROP_ATTRIB_FLAGS defaultAttributes = DBGPROP_ATTRIB_VALUE_IS_RETURN_VALUE | DBGPROP_ATTRIB_VALUE_IS_FAKE;
        WCHAR * finalName = AnewArray(GetArenaFromContext(pResolvedObject->scriptContext), WCHAR, RETURN_VALUE_MAX_NAME);
        if (returnValue->isValueOfReturnStatement)
        {
            swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[Return value]"));
            pResolvedObject->obj = frame->GetRegValue(Js::FunctionBody::ReturnValueRegSlot);
            pResolvedObject->address = Anew(frame->GetArena(), LocalObjectAddressForRegSlot, frame, Js::FunctionBody::ReturnValueRegSlot, pResolvedObject->obj);
        }
        else
        {
            if (returnValue->calledFunction->IsScriptFunction())
            {
                swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[%s returned]"), returnValue->calledFunction->GetFunctionBody()->GetDisplayName());
            }
            else
            {
                ENTER_PINNED_SCOPE(JavascriptString, displayName);
                displayName = returnValue->calledFunction->GetDisplayName();

                const char16 *builtInName = ParseFunctionName(displayName->GetString(), displayName->GetLength(), pResolvedObject->scriptContext);
                swprintf_s(finalName, RETURN_VALUE_MAX_NAME, _u("[%s returned]"), builtInName);

                LEAVE_PINNED_SCOPE();
            }
            pResolvedObject->obj = returnValue->returnedValue;
            defaultAttributes |= DBGPROP_ATTRIB_VALUE_READONLY;
            pResolvedObject->address = nullptr;
        }
        Assert(pResolvedObject->obj != nullptr);

        pResolvedObject->name = finalName;
        pResolvedObject->typeId = TypeIds_Object;

        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(defaultAttributes);
    }